

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

void __thiscall slang::ast::DriverVisitor::handle(DriverVisitor *this,CallExpression *expr)

{
  bool bVar1;
  Expression *pEVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar3;
  SubroutineSymbol **__y;
  CallExpression *in_RSI;
  long in_RDI;
  DriverVisitor visitor;
  SubroutineSymbol *subroutine;
  locator loc;
  size_t pos0;
  size_t hash;
  SubroutineSymbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SubroutineSymbol **in_stack_fffffffffffffd88;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *in_stack_fffffffffffffd90;
  SubroutineSymbol *in_stack_fffffffffffffd98;
  Statement *in_stack_fffffffffffffda0;
  DriverVisitor *in_stack_fffffffffffffda8;
  DriverVisitor *in_stack_fffffffffffffdb0;
  byte local_241;
  SubroutineSymbol **in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *in_stack_fffffffffffffe00;
  SubroutineSymbol *in_stack_fffffffffffffe58;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_170;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_168;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_150;
  CallExpression *local_148;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *local_138;
  DriverVisitor *local_130;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *local_128;
  DriverVisitor *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  Statement *local_78;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *local_70;
  DriverVisitor *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Statement *local_10;
  DriverVisitor *local_8;
  
  local_148 = in_RSI;
  bVar1 = CallExpression::isSystemCall((CallExpression *)0x9e32d1);
  if ((!bVar1) && (pEVar2 = CallExpression::thisClass(local_148), pEVar2 == (Expression *)0x0)) {
    ppSVar3 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          *)0x9e3301);
    local_150 = *ppSVar3;
    local_241 = 0;
    if (local_150->subroutineKind == Function) {
      in_stack_fffffffffffffda8 = (DriverVisitor *)(*(long *)(in_RDI + 0xa0) + 0x28);
      local_138 = &local_170;
      local_170 = local_150;
      local_130 = in_stack_fffffffffffffda8;
      local_128 = local_138;
      local_120 = in_stack_fffffffffffffda8;
      local_70 = local_138;
      local_68 = in_stack_fffffffffffffda8;
      local_78 = (Statement *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
                 ::key_from<slang::ast::SubroutineSymbol_const*>((SubroutineSymbol **)0x9e33b9);
      local_80 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
                 ::hash_for<slang::ast::SubroutineSymbol_const*>
                           (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                 ::position_for(in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
      local_10 = local_78;
      local_20 = local_80;
      in_stack_fffffffffffffdb0 = in_stack_fffffffffffffda8;
      local_18 = local_88;
      local_8 = in_stack_fffffffffffffda8;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_88);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::groups((table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                             *)0x9e3477);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                     ::elements((table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                                 *)0x9e34c6);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffd98 =
                 (SubroutineSymbol *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                         *)0x9e3516);
            in_stack_fffffffffffffda0 = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
                  ::key_from<slang::ast::SubroutineSymbol_const*>((SubroutineSymbol **)0x9e3543);
            bVar1 = std::equal_to<const_slang::ast::SubroutineSymbol_*>::operator()
                              ((equal_to<const_slang::ast::SubroutineSymbol_*> *)
                               in_stack_fffffffffffffd98,
                               (SubroutineSymbol **)in_stack_fffffffffffffda0,__y);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
              ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
              goto LAB_009e3637;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
        if (bVar1) {
          memset(&local_a0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
          ::table_locator(&local_a0);
          goto LAB_009e3637;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(size_t)in_stack_fffffffffffffdb0->callExpr);
      } while (bVar1);
      memset(&local_a0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
      ::table_locator(&local_a0);
LAB_009e3637:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a0);
      if (bVar1) {
        local_b0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e3657);
        local_b1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_b0,&local_b1);
      }
      else if (*(Symbol **)
                ((long)(in_stack_fffffffffffffda8->visitedValues).super_Storage.buffer + 0x10) <
               *(Symbol **)
                ((long)(in_stack_fffffffffffffda8->visitedValues).super_Storage.buffer + 8)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
        ::unchecked_emplace_at<slang::ast::SubroutineSymbol_const*>
                  ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                    *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
                   (size_t)in_stack_fffffffffffffda0,(SubroutineSymbol **)in_stack_fffffffffffffd98)
        ;
        local_c8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e36d7);
        local_e1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_c8,local_e1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::ast::SubroutineSymbol_const*>
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        local_f8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e373d);
        local_111[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_f8,local_111);
      }
      local_241 = local_168.second;
    }
    if ((local_241 & 1) != 0) {
      DriverVisitor(in_stack_fffffffffffffdb0,(Symbol *)in_stack_fffffffffffffda8,
                    (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                     *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                    (Expression *)in_stack_fffffffffffffd90);
      SubroutineSymbol::getBody(in_stack_fffffffffffffe58);
      Statement::visit<slang::ast::DriverVisitor&>
                (in_stack_fffffffffffffda0,(DriverVisitor *)in_stack_fffffffffffffd98);
      ~DriverVisitor((DriverVisitor *)0x9e37db);
    }
  }
  return;
}

Assistant:

void handle(const CallExpression& expr) {
        if (!expr.isSystemCall() && !expr.thisClass()) {
            auto& subroutine = *std::get<0>(expr.subroutine);
            if (subroutine.subroutineKind == SubroutineKind::Function &&
                visitedSubs.emplace(&subroutine).second) {

                DriverVisitor visitor(procedure, visitedSubs, subroutine, callExpr);
                subroutine.getBody().visit(visitor);
            }
        }
    }